

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name)

{
  App *in_stack_00000078;
  string *in_stack_00000080;
  string *in_stack_00000088;
  App *in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_b1 [17];
  allocator<char> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  App *in_stack_ffffffffffffff80;
  
  ::std::__cxx11::string::string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  App(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  ::std::__cxx11::string::~string(in_stack_ffffffffffffff30);
  ::std::__cxx11::string::~string(in_stack_ffffffffffffff30);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff77;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  set_help_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator(local_b1);
  ::std::__cxx11::string::~string(this_00);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  return;
}

Assistant:

explicit App(std::string app_description = "", std::string app_name = "")
        : App(app_description, app_name, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }